

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

void randomx_vm_set_cache(randomx_vm *machine,randomx_cache *cache)

{
  bool bVar1;
  
  bVar1 = std::operator!=(&machine->cacheKey,&cache->cacheKey);
  if ((!bVar1) && ((machine->mem).memory == cache->memory)) {
    return;
  }
  (*machine->_vptr_randomx_vm[6])(machine,cache);
  std::__cxx11::string::_M_assign((string *)&machine->cacheKey);
  return;
}

Assistant:

void randomx_vm_set_cache(randomx_vm *machine, randomx_cache* cache) {
		assert(machine != nullptr);
		assert(cache != nullptr && cache->isInitialized());
		if (machine->cacheKey != cache->cacheKey || machine->getMemory() != cache->memory) {
			machine->setCache(cache);
			machine->cacheKey = cache->cacheKey;
		}
	}